

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Table.cpp
# Opt level: O0

void __thiscall luna::Table::AppendToArray(Table *this,Value *value)

{
  bool bVar1;
  unique_ptr<std::vector<luna::Value,_std::allocator<luna::Value>_>,_std::default_delete<std::vector<luna::Value,_std::allocator<luna::Value>_>_>_>
  *this_00;
  vector<luna::Value,_std::allocator<luna::Value>_> *in_RSI;
  value_type *in_RDI;
  ValueT *__p;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<std::vector<luna::Value,_std::allocator<luna::Value>_>,_std::default_delete<std::vector<luna::Value,_std::allocator<luna::Value>_>_>_>
                      *)0x139e61);
  if (!bVar1) {
    __p = &in_RDI[1].type_;
    this_00 = (unique_ptr<std::vector<luna::Value,_std::allocator<luna::Value>_>,_std::default_delete<std::vector<luna::Value,_std::allocator<luna::Value>_>_>_>
               *)operator_new(0x18);
    std::vector<luna::Value,_std::allocator<luna::Value>_>::vector
              ((vector<luna::Value,_std::allocator<luna::Value>_> *)0x139e89);
    std::
    unique_ptr<std::vector<luna::Value,_std::allocator<luna::Value>_>,_std::default_delete<std::vector<luna::Value,_std::allocator<luna::Value>_>_>_>
    ::reset(this_00,(pointer)__p);
  }
  std::
  unique_ptr<std::vector<luna::Value,_std::allocator<luna::Value>_>,_std::default_delete<std::vector<luna::Value,_std::allocator<luna::Value>_>_>_>
  ::operator->((unique_ptr<std::vector<luna::Value,_std::allocator<luna::Value>_>,_std::default_delete<std::vector<luna::Value,_std::allocator<luna::Value>_>_>_>
                *)0x139ea5);
  std::vector<luna::Value,_std::allocator<luna::Value>_>::push_back(in_RSI,in_RDI);
  return;
}

Assistant:

void Table::AppendToArray(const Value &value)
    {
        if (!array_)
            array_.reset(new Array);
        array_->push_back(value);
    }